

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  RepeatedField<int> *pRVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  Rep *pRVar5;
  long lVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj;
  string *psVar8;
  int *piVar9;
  DescriptorProto *pDVar10;
  EnumDescriptorProto *pEVar11;
  ServiceDescriptorProto *pSVar12;
  FieldDescriptorProto *pFVar13;
  FileOptions *this_00;
  undefined8 *puVar14;
  uint uVar15;
  FileOptions *from;
  Arena *arena;
  long lVar16;
  int tmp;
  long lVar17;
  FileDescriptor *local_38;
  
  uVar3 = *(undefined8 *)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  uVar4 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar14 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar14 = (undefined8 *)*puVar14;
  }
  internal::ArenaStringPtr::Set(&proto->name_,uVar3,puVar14);
  lVar16 = *(long *)(this + 8);
  if (*(long *)(lVar16 + 8) != 0) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    uVar4 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar14 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      puVar14 = (undefined8 *)*puVar14;
    }
    internal::ArenaStringPtr::Set(&proto->package_,lVar16,puVar14);
  }
  if (this[0x3a] == (FileDescriptor)0x3) {
    pcVar7 = SyntaxName(SYNTAX_PROTO3);
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
    uVar4 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar14 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      puVar14 = (undefined8 *)*puVar14;
    }
    internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              (&proto->syntax_,pcVar7,puVar14);
  }
  if (0 < *(int *)(this + 0x20)) {
    lVar16 = 0;
    do {
      if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
        local_38 = this;
        std::
        call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
                  (*(once_flag **)(this + 0x18),DependenciesOnceInit,&local_38);
      }
      pRVar5 = (proto->dependency_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar5 == (Rep *)0x0) {
LAB_0034869d:
        obj = Arena::Create<std::__cxx11::string>
                        ((proto->dependency_).super_RepeatedPtrFieldBase.arena_);
        psVar8 = (string *)
                 internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           (&(proto->dependency_).super_RepeatedPtrFieldBase,obj);
      }
      else {
        iVar2 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar5->allocated_size <= iVar2) goto LAB_0034869d;
        (proto->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        psVar8 = (string *)pRVar5->elements[iVar2];
      }
      std::__cxx11::string::_M_assign(psVar8);
      lVar16 = lVar16 + 1;
    } while (lVar16 < *(int *)(this + 0x20));
  }
  if (0 < *(int *)(this + 0x24)) {
    pRVar1 = &proto->public_dependency_;
    uVar15 = (proto->public_dependency_).current_size_;
    lVar16 = 0;
    do {
      iVar2 = *(int *)(*(long *)(this + 0x48) + lVar16 * 4);
      if (uVar15 == (proto->public_dependency_).total_size_) {
        RepeatedField<int>::Reserve(pRVar1,uVar15 + 1);
        piVar9 = RepeatedField<int>::elements(pRVar1);
        piVar9[uVar15] = iVar2;
      }
      else {
        piVar9 = RepeatedField<int>::elements(pRVar1);
        piVar9[uVar15] = iVar2;
      }
      uVar15 = uVar15 + 1;
      pRVar1->current_size_ = uVar15;
      lVar16 = lVar16 + 1;
    } while (lVar16 < *(int *)(this + 0x24));
  }
  if (0 < *(int *)(this + 0x28)) {
    pRVar1 = &proto->weak_dependency_;
    uVar15 = (proto->weak_dependency_).current_size_;
    lVar16 = 0;
    do {
      iVar2 = *(int *)(*(long *)(this + 0x50) + lVar16 * 4);
      if (uVar15 == (proto->weak_dependency_).total_size_) {
        RepeatedField<int>::Reserve(pRVar1,uVar15 + 1);
        piVar9 = RepeatedField<int>::elements(pRVar1);
        piVar9[uVar15] = iVar2;
      }
      else {
        piVar9 = RepeatedField<int>::elements(pRVar1);
        piVar9[uVar15] = iVar2;
      }
      uVar15 = uVar15 + 1;
      pRVar1->current_size_ = uVar15;
      lVar16 = lVar16 + 1;
    } while (lVar16 < *(int *)(this + 0x28));
  }
  if (0 < *(int *)(this + 0x2c)) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      lVar6 = *(long *)(this + 0x58);
      pRVar5 = (proto->message_type_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar5 == (Rep *)0x0) {
LAB_003487da:
        pDVar10 = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto>
                            ((proto->message_type_).super_RepeatedPtrFieldBase.arena_);
        pDVar10 = (DescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->message_type_).super_RepeatedPtrFieldBase,pDVar10);
      }
      else {
        iVar2 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar5->allocated_size <= iVar2) goto LAB_003487da;
        (proto->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        pDVar10 = (DescriptorProto *)pRVar5->elements[iVar2];
      }
      Descriptor::CopyTo((Descriptor *)(lVar6 + lVar17),pDVar10);
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x88;
    } while (lVar16 < *(int *)(this + 0x2c));
  }
  if (0 < *(int *)(this + 0x30)) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      lVar6 = *(long *)(this + 0x60);
      pRVar5 = (proto->enum_type_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar5 == (Rep *)0x0) {
LAB_00348840:
        pEVar11 = Arena::CreateMaybeMessage<google::protobuf::EnumDescriptorProto>
                            ((proto->enum_type_).super_RepeatedPtrFieldBase.arena_);
        pEVar11 = (EnumDescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->enum_type_).super_RepeatedPtrFieldBase,pEVar11);
      }
      else {
        iVar2 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar5->allocated_size <= iVar2) goto LAB_00348840;
        (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        pEVar11 = (EnumDescriptorProto *)pRVar5->elements[iVar2];
      }
      EnumDescriptor::CopyTo((EnumDescriptor *)(lVar6 + lVar17),pEVar11);
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x48;
    } while (lVar16 < *(int *)(this + 0x30));
  }
  if (0 < *(int *)(this + 0x34)) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      lVar6 = *(long *)(this + 0x68);
      pRVar5 = (proto->service_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar5 == (Rep *)0x0) {
LAB_003488a3:
        pSVar12 = Arena::CreateMaybeMessage<google::protobuf::ServiceDescriptorProto>
                            ((proto->service_).super_RepeatedPtrFieldBase.arena_);
        pSVar12 = (ServiceDescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->service_).super_RepeatedPtrFieldBase,pSVar12);
      }
      else {
        iVar2 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar5->allocated_size <= iVar2) goto LAB_003488a3;
        (proto->service_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        pSVar12 = (ServiceDescriptorProto *)pRVar5->elements[iVar2];
      }
      ServiceDescriptor::CopyTo((ServiceDescriptor *)(lVar6 + lVar17),pSVar12);
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x30;
    } while (lVar16 < *(int *)(this + 0x34));
  }
  if (0 < *(int *)(this + 0x3c)) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      lVar6 = *(long *)(this + 0x70);
      pRVar5 = (proto->extension_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar5 == (Rep *)0x0) {
LAB_0034890f:
        pFVar13 = Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>
                            ((proto->extension_).super_RepeatedPtrFieldBase.arena_);
        pFVar13 = (FieldDescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(proto->extension_).super_RepeatedPtrFieldBase,pFVar13);
      }
      else {
        iVar2 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar5->allocated_size <= iVar2) goto LAB_0034890f;
        (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        pFVar13 = (FieldDescriptorProto *)pRVar5->elements[iVar2];
      }
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar6 + lVar17),pFVar13);
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0x48;
    } while (lVar16 < *(int *)(this + 0x3c));
  }
  from = *(FileOptions **)(this + 0x78);
  if (from != (FileOptions *)_FileOptions_default_instance_) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 8;
    this_00 = proto->options_;
    if (this_00 == (FileOptions *)0x0) {
      uVar4 = (proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      arena = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      this_00 = Arena::CreateMaybeMessage<google::protobuf::FileOptions>(arena);
      proto->options_ = this_00;
      from = *(FileOptions **)(this + 0x78);
    }
    FileOptions::CopyFrom(this_00,from);
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) proto->set_package(package());
  // TODO(liujisi): Also populate when syntax="proto2".
  if (syntax() == SYNTAX_PROTO3) proto->set_syntax(SyntaxName(syntax()));

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }

  if (&options() != &FileOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}